

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O3

void __thiscall
spdlog::details::async_log_helper::async_log_helper
          (async_log_helper *this,formatter_ptr *formatter,
          vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
          *sinks,size_t queue_size,log_err_handler *err_handler,
          async_overflow_policy overflow_policy,function<void_()> *worker_warmup_cb,
          milliseconds *flush_interval_ms,function<void_()> *worker_teardown_cb)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  undefined8 uVar4;
  thread local_50;
  async_log_helper *local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (formatter->super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  psVar3 = (sinks->
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_sinks).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (sinks->
       super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_sinks).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->_sinks).
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (sinks->
       super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (sinks->
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (sinks->
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (sinks->
  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::mpmc_bounded_queue
            (&this->_q,queue_size);
  *(undefined8 *)&(this->_err_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_err_handler).super__Function_base._M_functor + 8) = 0;
  (this->_err_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_err_handler)._M_invoker = err_handler->_M_invoker;
  if ((err_handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(err_handler->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->_err_handler).super__Function_base._M_functor =
         *(undefined8 *)&(err_handler->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->_err_handler).super__Function_base._M_functor + 8) = uVar4;
    (this->_err_handler).super__Function_base._M_manager =
         (err_handler->super__Function_base)._M_manager;
    (err_handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    err_handler->_M_invoker = (_Invoker_type)0x0;
  }
  this->_flush_requested = false;
  this->_terminate_requested = false;
  this->_overflow_policy = overflow_policy;
  *(undefined8 *)&(this->_worker_warmup_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_worker_warmup_cb).super__Function_base._M_functor + 8) = 0;
  (this->_worker_warmup_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_worker_warmup_cb)._M_invoker = worker_warmup_cb->_M_invoker;
  if ((worker_warmup_cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(worker_warmup_cb->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->_worker_warmup_cb).super__Function_base._M_functor =
         *(undefined8 *)&(worker_warmup_cb->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->_worker_warmup_cb).super__Function_base._M_functor + 8) = uVar4;
    (this->_worker_warmup_cb).super__Function_base._M_manager =
         (worker_warmup_cb->super__Function_base)._M_manager;
    (worker_warmup_cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    worker_warmup_cb->_M_invoker = (_Invoker_type)0x0;
  }
  (this->_flush_interval_ms).__r = flush_interval_ms->__r;
  *(undefined8 *)&(this->_worker_teardown_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_worker_teardown_cb).super__Function_base._M_functor + 8) = 0;
  (this->_worker_teardown_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_worker_teardown_cb)._M_invoker = worker_teardown_cb->_M_invoker;
  if ((worker_teardown_cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(worker_teardown_cb->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->_worker_teardown_cb).super__Function_base._M_functor =
         *(undefined8 *)&(worker_teardown_cb->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->_worker_teardown_cb).super__Function_base._M_functor + 8) = uVar4;
    (this->_worker_teardown_cb).super__Function_base._M_manager =
         (worker_teardown_cb->super__Function_base)._M_manager;
    (worker_teardown_cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    worker_teardown_cb->_M_invoker = (_Invoker_type)0x0;
  }
  (this->_worker_thread)._M_id._M_thread = 0;
  local_40 = worker_loop;
  local_38 = 0;
  local_48 = this;
  std::thread::
  thread<void(spdlog::details::async_log_helper::*)(),spdlog::details::async_log_helper*,void>
            (&local_50,(offset_in_async_log_helper_to_subr *)&local_40,&local_48);
  if ((this->_worker_thread)._M_id._M_thread == 0) {
    (this->_worker_thread)._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

inline spdlog::details::async_log_helper::async_log_helper(formatter_ptr formatter, std::vector<sink_ptr> sinks, size_t queue_size,
    log_err_handler err_handler, const async_overflow_policy overflow_policy, std::function<void()> worker_warmup_cb,
    const std::chrono::milliseconds &flush_interval_ms, std::function<void()> worker_teardown_cb)
    : _formatter(std::move(formatter))
    , _sinks(std::move(sinks))
    , _q(queue_size)
    , _err_handler(std::move(err_handler))
    , _flush_requested(false)
    , _terminate_requested(false)
    , _overflow_policy(overflow_policy)
    , _worker_warmup_cb(std::move(worker_warmup_cb))
    , _flush_interval_ms(flush_interval_ms)
    , _worker_teardown_cb(std::move(worker_teardown_cb))
{
    _worker_thread = std::thread(&async_log_helper::worker_loop, this);
}